

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O3

string * __thiscall
AmpIO::ReadRobotSerialNumber_abi_cxx11_(string *__return_storage_ptr__,AmpIO *this)

{
  BasePort *pBVar1;
  uint32_t uVar2;
  size_t sVar3;
  size_t i;
  long lVar4;
  uint32_t q;
  char buf [33];
  undefined2 local_4c [2];
  char local_48 [40];
  
  local_48[0x10] = '\0';
  local_48[0x11] = '\0';
  local_48[0x12] = '\0';
  local_48[0x13] = '\0';
  local_48[0x14] = '\0';
  local_48[0x15] = '\0';
  local_48[0x16] = '\0';
  local_48[0x17] = '\0';
  local_48[0x18] = '\0';
  local_48[0x19] = '\0';
  local_48[0x1a] = '\0';
  local_48[0x1b] = '\0';
  local_48[0x1c] = '\0';
  local_48[0x1d] = '\0';
  local_48[0x1e] = '\0';
  local_48[0x1f] = '\0';
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = '\0';
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  local_48[0x20] = 0;
  uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar2 == 0x64524131) {
    lVar4 = 0;
    do {
      pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
      (*pBVar1->_vptr_BasePort[0x24])
                (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,0xa002,
                 (ulong)((int)lVar4 + 0x1000000));
      Amp1394_Sleep(0.01);
      pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
      (*pBVar1->_vptr_BasePort[0x24])
                (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,0xa002,
                 (ulong)((int)lVar4 + 0x11000000));
      Amp1394_Sleep(0.01);
      pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
      (*pBVar1->_vptr_BasePort[0x23])
                (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,0xa031,local_4c);
      *(undefined2 *)(local_48 + lVar4 * 2) = local_4c[0];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x10);
    pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
    (*pBVar1->_vptr_BasePort[0x24])
              (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,0xa002,0);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar3 = strlen(local_48);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_48,local_48 + sVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string AmpIO::ReadRobotSerialNumber() const
{
    // Experimental: implementation will likely change
    const size_t read_length = 16; // 16 words, 32 bytes.
    char buf[read_length * 2 + 1] = {'\0'};
    if (GetHardwareVersion() == dRA1_String) {
        uint16_t* buf16 = reinterpret_cast<uint16_t*>(buf);
        uint32_t base_flash_addr = 0;
        for (size_t i = 0; i < read_length; i++) {
            for (uint32_t flash_en = 0; flash_en < 2; flash_en++) {
                uint32_t flash_command = (flash_en << 28) | (1 << 24) | (base_flash_addr + i) ;
                port->WriteQuadlet(BoardId, 0xa002, flash_command);
                Amp1394_Sleep(0.01);
            }
            uint32_t q;
            port->ReadQuadlet(BoardId, 0xa031, q);
            buf16[i] = q & 0xFFFF;
        }
        port->WriteQuadlet(BoardId, 0xa002, 0);
    }
    std::string serial_number(buf);
    return serial_number;
}